

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listTest.cpp
# Opt level: O1

void print<ft::list<std::__cxx11::string,ft::allocator<std::__cxx11::string>>>
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *t,char *s)

{
  long lVar1;
  undefined8 in_RAX;
  size_t sVar2;
  ostream *poVar3;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar4
  ;
  undefined8 uStack_38;
  
  lVar1 = std::cout;
  *(undefined8 *)(tolower + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar1 + -0x18) + 0x10f0c0);
  }
  else {
    sVar2 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  plVar4 = t->m_head->next;
  if (plVar4 != t->m_tail) {
    do {
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(plVar4->data)._M_dataplus._M_p,(plVar4->data)._M_string_length);
      plVar4 = plVar4->next;
    } while (plVar4 != t->m_tail);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T const & t, char const * s) {
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << ' ' << *it;
	std::cout << std::endl;
}